

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O3

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr __n;
  _Alloc_hider _Var3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  _Alloc_hider _Var8;
  const_iterator cVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  _Base_ptr p_Var12;
  ulong uVar13;
  ostream *poVar14;
  char *__s;
  string *name;
  pointer __k;
  char *pcVar15;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  string local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  TypedTestCasePState *local_c8;
  uint local_bc;
  undefined1 local_b8 [32];
  _Base_ptr local_98;
  size_t local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  stringstream *local_68;
  internal *local_60;
  char *local_58;
  string local_50;
  
  *this = (TypedTestCasePState)0x1;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = registered_tests + -1;
  local_c8 = this;
  local_bc = line;
  local_60 = (internal *)file;
  local_58 = registered_tests;
  do {
    pbVar1 = (byte *)(__s + 1);
    __s = __s + 1;
    iVar4 = isspace((uint)*pbVar1);
  } while (iVar4 != 0);
  do {
    pcVar6 = strchr(__s,0x2c);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    if (pcVar6 == (char *)0x0) {
      sVar7 = strlen(__s);
      pcVar6 = __s + sVar7;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,__s,pcVar6);
    _Var8._M_p = local_f0._M_dataplus._M_p;
    if (local_f0._M_string_length != 0) {
      pcVar6 = local_f0._M_dataplus._M_p + local_f0._M_string_length;
      do {
        _Var3._M_p = local_f0._M_dataplus._M_p;
        iVar4 = isspace((uint)(byte)pcVar6[-1]);
        _Var8._M_p = _Var3._M_p;
        if (iVar4 == 0) break;
        pcVar15 = pcVar6 + -1;
        uVar13 = (long)pcVar15 - (long)_Var3._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_f0,uVar13);
        pcVar6 = local_f0._M_dataplus._M_p + uVar13;
        _Var8._M_p = local_f0._M_dataplus._M_p;
      } while (pcVar15 != _Var3._M_p);
    }
    paVar2 = &local_f0.field_2;
    local_b8._0_8_ = _Var8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p == paVar2) {
      local_b8._24_8_ = local_f0.field_2._8_8_;
      local_b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_b8 + 0x10);
    }
    local_b8._17_7_ = local_f0.field_2._M_allocated_capacity._1_7_;
    local_b8[0x10] = local_f0.field_2._M_local_buf[0];
    local_b8._8_8_ = local_f0._M_string_length;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)paVar2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    __s = strchr(__s,0x2c);
    if (__s == (char *)0x0) {
      Message::Message((Message *)&local_d0);
      p_Var12 = (_Base_ptr)(local_b8 + 8);
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
      local_b8._16_8_ = 0;
      local_90 = 0;
      local_b8._24_8_ = p_Var12;
      local_98 = p_Var12;
      if (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_68 = local_d0.ptr_;
        poVar14 = (ostream *)(local_d0.ptr_ + 0x10);
        p_Var11 = (_Rb_tree_node_base *)(local_c8 + 0x10);
        __k = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_b8,__k);
          p_Var12 = (_Base_ptr)(local_b8 + 8);
          if (cVar9._M_node == p_Var12) {
            p_Var10 = *(_Rb_tree_node_base **)(local_c8 + 0x20);
            if (p_Var10 != p_Var11) {
              __n = (_Base_ptr)__k->_M_string_length;
              do {
                if ((__n == p_Var10[1]._M_parent) &&
                   ((__n == (_Base_ptr)0x0 ||
                    (iVar4 = bcmp((__k->_M_dataplus)._M_p,*(void **)(p_Var10 + 1),(size_t)__n),
                    iVar4 == 0)))) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_b8,__k);
                  goto LAB_00121d7a;
                }
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
              } while (p_Var10 != p_Var11);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"No test named ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(__k->_M_dataplus)._M_p,__k->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," can be found in this test case.\n",0x21);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Test ",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(__k->_M_dataplus)._M_p,__k->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," is listed more than once.\n",0x1b);
          }
LAB_00121d7a:
          __k = __k + 1;
        } while (__k != local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar4 = (int)p_Var12;
      p_Var11 = *(_Rb_tree_node_base **)(local_c8 + 0x20);
      p_Var10 = (_Rb_tree_node_base *)(local_c8 + 0x10);
      if (p_Var11 != p_Var10) {
        do {
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_b8,(key_type *)(p_Var11 + 1));
          p_Var12 = (_Base_ptr)(local_b8 + 8);
          if (cVar9._M_node == p_Var12) {
            poVar14 = (ostream *)(local_d0.ptr_ + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"You forgot to list test ",0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,".\n",2);
          }
          iVar4 = (int)p_Var12;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != p_Var10);
      }
      StringStreamToString(&local_f0,local_d0.ptr_);
      iVar5 = std::__cxx11::string::compare((char *)&local_f0);
      if (iVar5 != 0) {
        FormatFileLocation_abi_cxx11_(&local_50,local_60,(char *)(ulong)local_bc,iVar4);
        VerifyRegisteredTestNames();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
        if (local_d0.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)local_d0.ptr_ + 8))(local_d0.ptr_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        _Unwind_Resume(extraout_RAX);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b8);
      if (local_d0.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_d0.ptr_ + 8))(local_d0.ptr_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      return local_58;
    }
    do {
      pbVar1 = (byte *)(__s + 1);
      __s = __s + 1;
      iVar4 = isspace((uint)*pbVar1);
    } while (iVar4 != 0);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}